

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

int __thiscall
CDesign::GetWireInOverFlowBoundary
          (CDesign *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pWireList)

{
  int iVar1;
  CLayer *this_00;
  size_type sVar2;
  int local_1c;
  int i;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  *pWireList_local;
  CDesign *this_local;
  
  local_1c = 1;
  while( true ) {
    iVar1 = CBBox::T(&this->super_CBBox);
    if (iVar1 < local_1c) break;
    this_00 = GetLayer(this,local_1c);
    CLayer::GetWireInOverFlowBoundary(this_00,pWireList);
    local_1c = local_1c + 1;
  }
  sVar2 = __gnu_cxx::
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          ::size(pWireList);
  return (int)sVar2;
}

Assistant:

int CDesign::GetWireInOverFlowBoundary(hash_map<ADDRESS,int>* pWireList)
{
	for (int i=LAYER_METAL1;i<=T();++i)	GetLayer(i)->GetWireInOverFlowBoundary(pWireList);

	return	pWireList->size();
}